

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_reduce_512(secp256k1_scalar *r,uint64_t *l)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long *in_RSI;
  secp256k1_scalar *in_RDI;
  uint128_t t_13;
  uint64_t th_13;
  uint64_t tl_13;
  uint over_6;
  uint128_t t_12;
  uint64_t th_12;
  uint64_t tl_12;
  uint128_t t_11;
  uint64_t th_11;
  uint64_t tl_11;
  uint over_5;
  uint128_t t_10;
  uint64_t th_10;
  uint64_t tl_10;
  uint128_t t_9;
  uint64_t th_9;
  uint64_t tl_9;
  uint128_t t_8;
  uint64_t th_8;
  uint64_t tl_8;
  uint over_4;
  uint128_t t_7;
  uint64_t th_7;
  uint64_t tl_7;
  uint over_3;
  uint128_t t_6;
  uint64_t th_6;
  uint64_t tl_6;
  uint128_t t_5;
  uint64_t th_5;
  uint64_t tl_5;
  uint over_2;
  uint over_1;
  uint128_t t_4;
  uint64_t th_4;
  uint64_t tl_4;
  uint128_t t_3;
  uint64_t th_3;
  uint64_t tl_3;
  uint over;
  uint128_t t_2;
  uint64_t th_2;
  uint64_t tl_2;
  uint128_t t_1;
  uint64_t th_1;
  uint64_t tl_1;
  uint128_t t;
  uint64_t th;
  uint64_t tl;
  uint32_t p4;
  uint64_t p3;
  uint64_t p2;
  uint64_t p1;
  uint64_t p0;
  uint32_t m6;
  uint64_t m5;
  uint64_t m4;
  uint64_t m3;
  uint64_t m2;
  uint64_t m1;
  uint64_t m0;
  uint64_t n3;
  uint64_t n2;
  uint64_t n1;
  uint64_t n0;
  uint64_t c2;
  uint64_t c1;
  uint64_t c0;
  uint128_t c;
  ulong local_2e8;
  ulong local_2b8;
  long local_2b0;
  ulong local_298;
  long local_290;
  ulong local_268;
  long local_260;
  ulong local_248;
  long local_240;
  ulong local_228;
  long local_220;
  ulong local_1f8;
  long local_1f0;
  ulong local_1c8;
  long local_1c0;
  ulong local_1a8;
  long local_1a0;
  ulong local_178;
  long local_170;
  ulong local_158;
  long local_150;
  ulong local_128;
  long local_120;
  ulong local_108;
  long local_100;
  ulong local_e8;
  long local_e0;
  uint local_30;
  uint64_t local_28;
  ulong local_20;
  
  uVar28 = in_RSI[4];
  uVar30 = in_RSI[5];
  uVar32 = in_RSI[6];
  uVar31 = in_RSI[7];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar28;
  local_e0 = SUB168(auVar1 * ZEXT816(0x402da1732fc9bebf),8);
  local_e8 = SUB168(auVar1 * ZEXT816(0x402da1732fc9bebf),0);
  uVar19 = in_RSI[1] + (int)(uint)(local_e8 + *in_RSI < local_e8) + local_e0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar30;
  local_100 = SUB168(auVar2 * ZEXT816(0x402da1732fc9bebf),8);
  local_108 = SUB168(auVar2 * ZEXT816(0x402da1732fc9bebf),0);
  uVar20 = local_108 + uVar19;
  uVar21 = (int)(uint)(uVar20 < local_108) + local_100;
  uVar19 = uVar21 + (long)(int)(uint)(uVar19 < (ulong)in_RSI[1]);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar28;
  local_120 = SUB168(auVar3 * ZEXT816(0x4551231950b75fc4),8);
  local_128 = SUB168(auVar3 * ZEXT816(0x4551231950b75fc4),0);
  uVar20 = local_128 + uVar20;
  uVar22 = (int)(uint)(uVar20 < local_128) + local_120;
  uVar23 = uVar22 + uVar19;
  uVar24 = uVar23 + in_RSI[2];
  uVar16 = (uint)(uVar24 < (ulong)in_RSI[2]);
  uVar19 = (long)(int)(uint)(uVar23 < uVar22) + (long)(int)(uint)(uVar19 < uVar21) + (ulong)uVar16;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar32;
  local_150 = SUB168(auVar4 * ZEXT816(0x402da1732fc9bebf),8);
  local_158 = SUB168(auVar4 * ZEXT816(0x402da1732fc9bebf),0);
  uVar24 = local_158 + uVar24;
  uVar21 = (int)(uint)(uVar24 < local_158) + local_150;
  uVar22 = uVar21 + uVar19;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar30;
  local_170 = SUB168(auVar5 * ZEXT816(0x4551231950b75fc4),8);
  local_178 = SUB168(auVar5 * ZEXT816(0x4551231950b75fc4),0);
  uVar24 = local_178 + uVar24;
  uVar23 = (int)(uint)(uVar24 < local_178) + local_170;
  uVar25 = uVar23 + uVar22;
  uVar24 = uVar24 + uVar28;
  uVar26 = uVar25 + (uint)(uVar24 < uVar28);
  uVar27 = uVar26 + in_RSI[3];
  uVar17 = (uint)(uVar27 < (ulong)in_RSI[3]);
  uVar28 = (long)(int)(uint)(uVar25 < uVar23) +
           (long)(int)(uint)(uVar22 < uVar21) + (ulong)(uVar19 < uVar16) +
           (ulong)(uVar26 < (uint)(uVar24 < uVar28)) + (ulong)uVar17;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar31;
  local_1a0 = SUB168(auVar6 * ZEXT816(0x402da1732fc9bebf),8);
  local_1a8 = SUB168(auVar6 * ZEXT816(0x402da1732fc9bebf),0);
  uVar27 = local_1a8 + uVar27;
  uVar19 = (int)(uint)(uVar27 < local_1a8) + local_1a0;
  uVar21 = uVar19 + uVar28;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar32;
  local_1c0 = SUB168(auVar7 * ZEXT816(0x4551231950b75fc4),8);
  local_1c8 = SUB168(auVar7 * ZEXT816(0x4551231950b75fc4),0);
  uVar27 = local_1c8 + uVar27;
  uVar22 = (int)(uint)(uVar27 < local_1c8) + local_1c0;
  uVar23 = uVar22 + uVar21;
  uVar27 = uVar27 + uVar30;
  uVar25 = uVar23 + (uint)(uVar27 < uVar30);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar31;
  local_1f0 = SUB168(auVar8 * ZEXT816(0x4551231950b75fc4),8);
  local_1f8 = SUB168(auVar8 * ZEXT816(0x4551231950b75fc4),0);
  uVar29 = local_1f8 + uVar25;
  uVar26 = (int)(uint)(uVar29 < local_1f8) + local_1f0;
  uVar28 = uVar26 + (long)(int)(uint)(uVar23 < uVar22) +
                    (long)(int)(uint)(uVar21 < uVar19) + (ulong)(uVar28 < uVar17) +
                    (ulong)(uVar25 < (uint)(uVar27 < uVar30));
  uVar29 = uVar32 + uVar29;
  uVar30 = (uint)(uVar29 < uVar32) + uVar28;
  uVar19 = uVar31 + uVar30;
  local_30 = (uint)(uVar19 < uVar31) +
             (uint)(uVar30 < (uint)(uVar29 < uVar32)) + (uint)(uVar28 < uVar26);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar29;
  local_220 = SUB168(auVar9 * ZEXT816(0x402da1732fc9bebf),8);
  local_228 = SUB168(auVar9 * ZEXT816(0x402da1732fc9bebf),0);
  uVar28 = local_228 + local_e8 + *in_RSI;
  uVar30 = uVar20 + (int)(uint)(uVar28 < local_228) + local_220;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar19;
  local_240 = SUB168(auVar10 * ZEXT816(0x402da1732fc9bebf),8);
  local_248 = SUB168(auVar10 * ZEXT816(0x402da1732fc9bebf),0);
  uVar31 = local_248 + uVar30;
  uVar32 = (int)(uint)(uVar31 < local_248) + local_240;
  uVar30 = uVar32 + (long)(int)(uint)(uVar30 < uVar20);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar29;
  local_260 = SUB168(auVar11 * ZEXT816(0x4551231950b75fc4),8);
  local_268 = SUB168(auVar11 * ZEXT816(0x4551231950b75fc4),0);
  uVar31 = local_268 + uVar31;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar31;
  uVar31 = (int)(uint)(uVar31 < local_268) + local_260;
  uVar21 = uVar31 + uVar30;
  uVar22 = uVar21 + uVar24;
  uVar16 = (uint)(uVar22 < uVar24);
  uVar30 = (long)(int)(uint)(uVar21 < uVar31) + (long)(int)(uint)(uVar30 < uVar32) + (ulong)uVar16;
  local_290 = SUB168(ZEXT416(local_30) * ZEXT816(0x402da1732fc9bebf),8);
  local_298 = SUB168(ZEXT416(local_30) * ZEXT816(0x402da1732fc9bebf),0);
  uVar22 = local_298 + uVar22;
  uVar32 = (int)(uint)(uVar22 < local_298) + local_290;
  uVar31 = uVar32 + uVar30;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar19;
  local_2b0 = SUB168(auVar12 * ZEXT816(0x4551231950b75fc4),8);
  local_2b8 = SUB168(auVar12 * ZEXT816(0x4551231950b75fc4),0);
  uVar22 = local_2b8 + uVar22;
  uVar21 = (int)(uint)(uVar22 < local_2b8) + local_2b0;
  uVar20 = uVar21 + uVar31;
  uVar22 = uVar29 + uVar22;
  uVar23 = (uint)(uVar22 < uVar29) + uVar20;
  uVar25 = uVar27 + uVar23;
  local_2e8 = SUB168(ZEXT416(local_30) * ZEXT816(0x4551231950b75fc4),0);
  uVar24 = local_2e8 + uVar25;
  uVar26 = uVar19 + uVar24;
  local_30 = (uint)(uVar26 < uVar19) +
             (uint)(uVar24 < local_2e8) + SUB164(ZEXT416(local_30) * ZEXT816(0x4551231950b75fc4),8)
             + (uint)(uVar25 < uVar27) +
               (uint)(uVar23 < (uint)(uVar22 < uVar29)) +
               (uint)(uVar20 < uVar21) + (uint)(uVar31 < uVar32) + (uint)(uVar30 < uVar16) +
             local_30;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar28;
  auVar13 = ZEXT416(local_30) * ZEXT816(0x402da1732fc9bebf) + auVar13;
  local_28 = auVar13._0_8_;
  in_RDI->d[0] = local_28;
  local_20 = auVar13._8_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_20;
  auVar15 = ZEXT416(local_30) * ZEXT816(0x4551231950b75fc4) + auVar14 + auVar15;
  uVar28 = auVar15._8_8_;
  in_RDI->d[1] = auVar15._0_8_;
  uVar32 = uVar22 + local_30;
  uVar30 = (ulong)CARRY8(uVar22,(ulong)local_30) + (ulong)CARRY8(uVar28,uVar32);
  in_RDI->d[2] = uVar28 + uVar32;
  in_RDI->d[3] = uVar30 + uVar26;
  local_28._0_4_ = (uint)CARRY8(uVar30,uVar26);
  iVar18 = secp256k1_scalar_check_overflow(in_RDI);
  secp256k1_scalar_reduce(in_RDI,(uint)local_28 + iVar18);
  return;
}

Assistant:

static void secp256k1_scalar_reduce_512(secp256k1_scalar *r, const uint64_t *l) {
#ifdef USE_ASM_X86_64
    /* Reduce 512 bits into 385. */
    uint64_t m0, m1, m2, m3, m4, m5, m6;
    uint64_t p0, p1, p2, p3, p4;
    uint64_t c;

    __asm__ __volatile__(
    /* Preload. */
    "movq 32(%%rsi), %%r11\n"
    "movq 40(%%rsi), %%r12\n"
    "movq 48(%%rsi), %%r13\n"
    "movq 56(%%rsi), %%r14\n"
    /* Initialize r8,r9,r10 */
    "movq 0(%%rsi), %%r8\n"
    "xorq %%r9, %%r9\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9) += n0 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* extract m0 */
    "movq %%r8, %q0\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10) += l1 */
    "addq 8(%%rsi), %%r9\n"
    "adcq $0, %%r10\n"
    /* (r9,r10,r8) += n1 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += n0 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m1 */
    "movq %%r9, %q1\n"
    "xorq %%r9, %%r9\n"
    /* (r10,r8,r9) += l2 */
    "addq 16(%%rsi), %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n2 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n1 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n0 */
    "addq %%r11, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract m2 */
    "movq %%r10, %q2\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9,r10) += l3 */
    "addq 24(%%rsi), %%r8\n"
    "adcq $0, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n3 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n2 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n1 */
    "addq %%r12, %%r8\n"
    "adcq $0, %%r9\n"
    "adcq $0, %%r10\n"
    /* extract m3 */
    "movq %%r8, %q3\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10,r8) += n3 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += n2 */
    "addq %%r13, %%r9\n"
    "adcq $0, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m4 */
    "movq %%r9, %q4\n"
    /* (r10,r8) += n3 */
    "addq %%r14, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m5 */
    "movq %%r10, %q5\n"
    /* extract m6 */
    "movq %%r8, %q6\n"
    : "=g"(m0), "=g"(m1), "=g"(m2), "=g"(m3), "=g"(m4), "=g"(m5), "=g"(m6)
    : "S"(l), "n"(SECP256K1_N_C_0), "n"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "r11", "r12", "r13", "r14", "cc");

    /* Reduce 385 bits into 258. */
    __asm__ __volatile__(
    /* Preload */
    "movq %q9, %%r11\n"
    "movq %q10, %%r12\n"
    "movq %q11, %%r13\n"
    /* Initialize (r8,r9,r10) */
    "movq %q5, %%r8\n"
    "xorq %%r9, %%r9\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9) += m4 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* extract p0 */
    "movq %%r8, %q0\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10) += m1 */
    "addq %q6, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r9,r10,r8) += m5 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += m4 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract p1 */
    "movq %%r9, %q1\n"
    "xorq %%r9, %%r9\n"
    /* (r10,r8,r9) += m2 */
    "addq %q7, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m6 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m5 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m4 */
    "addq %%r11, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract p2 */
    "movq %%r10, %q2\n"
    /* (r8,r9) += m3 */
    "addq %q8, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r8,r9) += m6 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* (r8,r9) += m5 */
    "addq %%r12, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract p3 */
    "movq %%r8, %q3\n"
    /* (r9) += m6 */
    "addq %%r13, %%r9\n"
    /* extract p4 */
    "movq %%r9, %q4\n"
    : "=&g"(p0), "=&g"(p1), "=&g"(p2), "=g"(p3), "=g"(p4)
    : "g"(m0), "g"(m1), "g"(m2), "g"(m3), "g"(m4), "g"(m5), "g"(m6), "n"(SECP256K1_N_C_0), "n"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "r11", "r12", "r13", "cc");

    /* Reduce 258 bits into 256. */
    __asm__ __volatile__(
    /* Preload */
    "movq %q5, %%r10\n"
    /* (rax,rdx) = p4 * c0 */
    "movq %7, %%rax\n"
    "mulq %%r10\n"
    /* (rax,rdx) += p0 */
    "addq %q1, %%rax\n"
    "adcq $0, %%rdx\n"
    /* extract r0 */
    "movq %%rax, 0(%q6)\n"
    /* Move to (r8,r9) */
    "movq %%rdx, %%r8\n"
    "xorq %%r9, %%r9\n"
    /* (r8,r9) += p1 */
    "addq %q2, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r8,r9) += p4 * c1 */
    "movq %8, %%rax\n"
    "mulq %%r10\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* Extract r1 */
    "movq %%r8, 8(%q6)\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r8) += p4 */
    "addq %%r10, %%r9\n"
    "adcq $0, %%r8\n"
    /* (r9,r8) += p2 */
    "addq %q3, %%r9\n"
    "adcq $0, %%r8\n"
    /* Extract r2 */
    "movq %%r9, 16(%q6)\n"
    "xorq %%r9, %%r9\n"
    /* (r8,r9) += p3 */
    "addq %q4, %%r8\n"
    "adcq $0, %%r9\n"
    /* Extract r3 */
    "movq %%r8, 24(%q6)\n"
    /* Extract c */
    "movq %%r9, %q0\n"
    : "=g"(c)
    : "g"(p0), "g"(p1), "g"(p2), "g"(p3), "g"(p4), "D"(r), "n"(SECP256K1_N_C_0), "n"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "cc", "memory");
#else
    uint128_t c;
    uint64_t c0, c1, c2;
    uint64_t n0 = l[4], n1 = l[5], n2 = l[6], n3 = l[7];
    uint64_t m0, m1, m2, m3, m4, m5;
    uint32_t m6;
    uint64_t p0, p1, p2, p3;
    uint32_t p4;

    /* Reduce 512 bits into 385. */
    /* m[0..6] = l[0..3] + n[0..3] * SECP256K1_N_C. */
    c0 = l[0]; c1 = 0; c2 = 0;
    muladd_fast(n0, SECP256K1_N_C_0);
    extract_fast(m0);
    sumadd_fast(l[1]);
    muladd(n1, SECP256K1_N_C_0);
    muladd(n0, SECP256K1_N_C_1);
    extract(m1);
    sumadd(l[2]);
    muladd(n2, SECP256K1_N_C_0);
    muladd(n1, SECP256K1_N_C_1);
    sumadd(n0);
    extract(m2);
    sumadd(l[3]);
    muladd(n3, SECP256K1_N_C_0);
    muladd(n2, SECP256K1_N_C_1);
    sumadd(n1);
    extract(m3);
    muladd(n3, SECP256K1_N_C_1);
    sumadd(n2);
    extract(m4);
    sumadd_fast(n3);
    extract_fast(m5);
    VERIFY_CHECK(c0 <= 1);
    m6 = c0;

    /* Reduce 385 bits into 258. */
    /* p[0..4] = m[0..3] + m[4..6] * SECP256K1_N_C. */
    c0 = m0; c1 = 0; c2 = 0;
    muladd_fast(m4, SECP256K1_N_C_0);
    extract_fast(p0);
    sumadd_fast(m1);
    muladd(m5, SECP256K1_N_C_0);
    muladd(m4, SECP256K1_N_C_1);
    extract(p1);
    sumadd(m2);
    muladd(m6, SECP256K1_N_C_0);
    muladd(m5, SECP256K1_N_C_1);
    sumadd(m4);
    extract(p2);
    sumadd_fast(m3);
    muladd_fast(m6, SECP256K1_N_C_1);
    sumadd_fast(m5);
    extract_fast(p3);
    p4 = c0 + m6;
    VERIFY_CHECK(p4 <= 2);

    /* Reduce 258 bits into 256. */
    /* r[0..3] = p[0..3] + p[4] * SECP256K1_N_C. */
    c = p0 + (uint128_t)SECP256K1_N_C_0 * p4;
    r->d[0] = c & 0xFFFFFFFFFFFFFFFFULL; c >>= 64;
    c += p1 + (uint128_t)SECP256K1_N_C_1 * p4;
    r->d[1] = c & 0xFFFFFFFFFFFFFFFFULL; c >>= 64;
    c += p2 + (uint128_t)p4;
    r->d[2] = c & 0xFFFFFFFFFFFFFFFFULL; c >>= 64;
    c += p3;
    r->d[3] = c & 0xFFFFFFFFFFFFFFFFULL; c >>= 64;
#endif

    /* Final reduction of r. */
    secp256k1_scalar_reduce(r, c + secp256k1_scalar_check_overflow(r));
}